

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npy.h
# Opt level: O2

string * npy::pyparse::write_tuple<unsigned_long>
                   (string *__return_storage_ptr__,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *v)

{
  ostream *poVar1;
  string delimiter;
  ostringstream ss;
  allocator local_1d0 [16];
  undefined8 local_1c0 [4];
  ostream *local_1a0;
  undefined8 local_198;
  ostringstream local_190 [376];
  
  if ((v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)local_190);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_190);
    if ((long)(v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start == 8) {
      poVar1 = std::operator<<((ostream *)local_190,"(");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1,",)");
    }
    else {
      std::__cxx11::string::string((string *)local_1c0,", ",local_1d0);
      std::operator<<((ostream *)local_190,"(");
      local_198 = local_1c0[0];
      local_1a0 = (ostream *)local_190;
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::ostream_iterator<unsigned_long,char,std::char_traits<char>>>
                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_1d0,
                 (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start,
                 (ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *)
                 ((v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish + -1));
      std::ostream::_M_insert<unsigned_long>((ulong)local_190);
      std::operator<<((ostream *)local_190,")");
      std::__cxx11::string::~string((string *)local_1c0);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string write_tuple(const std::vector<T> &v)
{
    if (v.size() == 0)
        return "";

    std::ostringstream ss;

    if (v.size() == 1)
    {
        ss << "(" << v.front() << ",)";
    }
    else
    {
        const std::string delimiter = ", ";
        // v.size() > 1
        ss << "(";
        std::copy(v.begin(), v.end() - 1, std::ostream_iterator<T>(ss, delimiter.c_str()));
        ss << v.back();
        ss << ")";
    }

    return ss.str();
}